

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geodesic.cpp
# Opt level: O1

Geodesic * Geodesic::getGeodesic(Geodesic *__return_storage_ptr__,PhyloTree *t1,PhyloTree *t2)

{
  pointer pbVar1;
  pointer pbVar2;
  pointer pdVar3;
  pointer pdVar4;
  size_t __n;
  double dVar5;
  int iVar6;
  invalid_argument *piVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *t2_edges;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *t1_edges;
  double dVar11;
  vector<PhyloTree,_std::allocator<PhyloTree>_> aTreesNoCommonEdges;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> eic;
  vector<PhyloTree,_std::allocator<PhyloTree>_> bTreesNoCommonEdges;
  Geodesic newGeo;
  vector<PhyloTree,_std::allocator<PhyloTree>_> local_118;
  PhyloTree *local_100;
  PhyloTree *local_f8;
  double local_f0;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> local_e8;
  vector<PhyloTree,_std::allocator<PhyloTree>_> local_c8;
  Geodesic local_a8;
  RatioSequence local_68;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> local_48;
  
  RatioSequence::RatioSequence(&local_a8.rs);
  Geodesic(__return_storage_ptr__,&local_a8.rs);
  std::vector<Ratio,_std::allocator<Ratio>_>::~vector(&local_a8.rs._RatioSequence);
  if ((long)(t1->leaf2NumMap).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(t1->leaf2NumMap).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
      (long)(t2->leaf2NumMap).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(t2->leaf2NumMap).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
    piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar7,"Error getting geodesic: trees do not have the same number of leaves");
    __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pbVar1 = (t1->leaf2NumMap).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar10 = (long)(t1->leaf2NumMap).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  local_100 = t1;
  local_f8 = t2;
  if (lVar10 == 0) {
    dVar5 = 0.0;
  }
  else {
    lVar10 = lVar10 >> 5;
    pbVar2 = (t2->leaf2NumMap).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar3 = (t2->leafEdgeLengths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (t1->leafEdgeLengths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar10 = lVar10 + (ulong)(lVar10 == 0);
    dVar5 = 0.0;
    lVar8 = 0;
    do {
      __n = *(size_t *)((long)&pbVar1->_M_string_length + lVar8 * 4);
      if ((__n != *(size_t *)((long)&pbVar2->_M_string_length + lVar8 * 4)) ||
         ((__n != 0 &&
          (local_f0 = dVar5,
          iVar6 = bcmp(*(void **)((long)&(pbVar1->_M_dataplus)._M_p + lVar8 * 4),
                       *(void **)((long)&(pbVar2->_M_dataplus)._M_p + lVar8 * 4),__n),
          dVar5 = local_f0, iVar6 != 0)))) {
        piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument
                  (piVar7,"Error getting geodesic: trees do not have the same sets of leaves");
        __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      dVar11 = *(double *)((long)pdVar4 + lVar8) - *(double *)((long)pdVar3 + lVar8);
      dVar5 = dVar5 + dVar11 * dVar11;
      lVar8 = lVar8 + 8;
      lVar10 = lVar10 + -1;
    } while (lVar10 != 0);
  }
  __return_storage_ptr__->leafContributionSquared = dVar5;
  local_118.super__Vector_base<PhyloTree,_std::allocator<PhyloTree>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118.super__Vector_base<PhyloTree,_std::allocator<PhyloTree>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.super__Vector_base<PhyloTree,_std::allocator<PhyloTree>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.super__Vector_base<PhyloTree,_std::allocator<PhyloTree>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  local_c8.super__Vector_base<PhyloTree,_std::allocator<PhyloTree>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_c8.super__Vector_base<PhyloTree,_std::allocator<PhyloTree>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  t1_edges = &local_100->edges;
  t2_edges = &local_f8->edges;
  splitOnCommonEdge(t1_edges,t2_edges,&local_100->leaf2NumMap,&local_118,&local_c8);
  local_e8.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  PhyloTree::getCommonEdges(t1_edges,t2_edges,&local_e8);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::vector(&local_48,&local_e8);
  local_a8.rs.combineCode =
       (long)(__return_storage_ptr__->commonEdges).
             super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_a8.rs._RatioSequence.super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(__return_storage_ptr__->commonEdges).
                super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
                super__Vector_impl_data._M_finish;
  local_a8.rs._RatioSequence.super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(__return_storage_ptr__->commonEdges).
                super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->commonEdges).
  super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.super__Vector_impl_data.
  _M_start = local_48.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
             super__Vector_impl_data._M_start;
  (__return_storage_ptr__->commonEdges).
  super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_48.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
              super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->commonEdges).
  super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_48.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_48.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector
            ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)&local_a8);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_48);
  if (local_118.super__Vector_base<PhyloTree,_std::allocator<PhyloTree>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_118.super__Vector_base<PhyloTree,_std::allocator<PhyloTree>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar10 = 0;
    uVar9 = 0;
    do {
      getGeodesicNoCommonEdges
                (&local_a8,
                 (PhyloTree *)
                 ((long)&((local_118.super__Vector_base<PhyloTree,_std::allocator<PhyloTree>_>.
                           _M_impl.super__Vector_impl_data._M_start)->newick)._M_dataplus._M_p +
                 lVar10),(PhyloTree *)
                         ((long)&((local_c8.
                                   super__Vector_base<PhyloTree,_std::allocator<PhyloTree>_>._M_impl
                                   .super__Vector_impl_data._M_start)->newick)._M_dataplus._M_p +
                         lVar10));
      RatioSequence::interleave(&local_68,&__return_storage_ptr__->rs,&local_a8.rs);
      (__return_storage_ptr__->rs).combineCode = local_68.combineCode;
      std::vector<Ratio,_std::allocator<Ratio>_>::operator=
                (&(__return_storage_ptr__->rs)._RatioSequence,&local_68._RatioSequence);
      std::vector<Ratio,_std::allocator<Ratio>_>::~vector(&local_68._RatioSequence);
      std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_a8.commonEdges);
      std::vector<Ratio,_std::allocator<Ratio>_>::~vector(&local_a8.rs._RatioSequence);
      uVar9 = uVar9 + 1;
      lVar10 = lVar10 + 0x68;
    } while (uVar9 < (ulong)(((long)local_118.
                                    super__Vector_base<PhyloTree,_std::allocator<PhyloTree>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_118.
                                    super__Vector_base<PhyloTree,_std::allocator<PhyloTree>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 3) *
                            0x4ec4ec4ec4ec4ec5));
  }
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_e8);
  std::vector<PhyloTree,_std::allocator<PhyloTree>_>::~vector(&local_c8);
  std::vector<PhyloTree,_std::allocator<PhyloTree>_>::~vector(&local_118);
  return __return_storage_ptr__;
}

Assistant:

Geodesic Geodesic::getGeodesic(PhyloTree &t1, PhyloTree &t2) {
    double leafContributionSquared = 0;
    vector<double>& t1_leaf_lengths = t1.leafEdgeLengths;
    vector<double>& t2_leaf_lengths = t2.leafEdgeLengths;
    Geodesic geo = Geodesic(RatioSequence());

    // get the leaf contributions
    auto& ref_leaf_num_map = t1.leaf2NumMap;
    auto& chk_leaf_num_map = t2.leaf2NumMap;
    if (ref_leaf_num_map.size() != chk_leaf_num_map.size()) {
        throw invalid_argument("Error getting geodesic: trees do not have the same number of leaves");
    }
    for (size_t i = 0; i < ref_leaf_num_map.size(); i++) {
        if (ref_leaf_num_map[i] != chk_leaf_num_map[i]) {
            throw invalid_argument("Error getting geodesic: trees do not have the same sets of leaves");
        }
        leafContributionSquared += pow(t1_leaf_lengths[i] - t2_leaf_lengths[i], 2);
    }
    geo.setLeafContributionSquared(leafContributionSquared);

    vector<PhyloTree> aTreesNoCommonEdges;
    vector<PhyloTree> bTreesNoCommonEdges;

    // get the pairs of trees with no common edges put into aTreesNoCommonEdges and bTreesNoCommonEdges
    //  aTreesNoCommonEdges[i] goes with bTreesNoCommonEdges[i]
    auto& t1_edges = t1.edges;
    auto& t2_edges = t2.edges;
    auto& l2nm = t1.leaf2NumMap;
    splitOnCommonEdge(t1_edges, t2_edges, l2nm, aTreesNoCommonEdges, bTreesNoCommonEdges);
//    splitOnCommonEdge(t1, t2, aTreesNoCommonEdges, bTreesNoCommonEdges);
    //set the common edges
    vector<PhyloTreeEdge> eic;
    PhyloTree::getCommonEdges(t1_edges, t2_edges, eic);
    geo.setCommonEdges(eic);

    // find the geodesic between each pair of subtrees found by removing the common edges
    for (size_t i = 0; i < aTreesNoCommonEdges.size(); i++) {
        Geodesic newGeo = getGeodesicNoCommonEdges(aTreesNoCommonEdges[i], bTreesNoCommonEdges[i]);
        geo.setRS(RatioSequence::interleave(geo.getRS(), newGeo.getRS()));
    }
    return geo;
}